

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_strong_sensor_bc
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL strong_value,REF_DICT ref_dict_bcs)

{
  int iVar1;
  REF_CELL pRVar2;
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_BOOL RVar6;
  long lVar7;
  int iVar8;
  REF_INT cell;
  REF_INT bc;
  REF_INT nodes [27];
  REF_INT local_c0;
  uint local_bc;
  REF_GRID local_b8;
  REF_DBL local_b0;
  REF_INT local_a8 [30];
  
  local_b0 = strong_value;
  if (ref_grid->twod != 0) {
    pRVar2 = ref_grid->cell[0];
    bVar3 = 0 < pRVar2->max;
    if (0 < pRVar2->max) {
      iVar8 = 0;
      local_b8 = (REF_GRID)ref_dict_bcs;
      do {
        RVar4 = ref_cell_nodes(pRVar2,iVar8,local_a8);
        if (RVar4 == 0) {
          local_c0 = -1;
          uVar5 = ref_dict_value((REF_DICT)local_b8,local_a8[pRVar2->node_per],&local_c0);
          if ((uVar5 != 0) && (uVar5 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x538,"ref_phys_strong_sensor_bc",(ulong)uVar5,"bc");
            local_bc = uVar5;
          }
          if ((uVar5 != 5) && (uVar5 != 0)) break;
          RVar6 = ref_phys_wall_distance_bc(local_c0);
          if ((RVar6 != 0) && (iVar1 = pRVar2->node_per, 0 < (long)iVar1)) {
            lVar7 = 0;
            do {
              scalar[local_a8[lVar7]] = local_b0;
              lVar7 = lVar7 + 1;
            } while (iVar1 != lVar7);
          }
        }
        iVar8 = iVar8 + 1;
        bVar3 = iVar8 < pRVar2->max;
      } while (iVar8 < pRVar2->max);
    }
    if (!bVar3) {
      return 0;
    }
    return local_bc;
  }
  pRVar2 = ref_grid->cell[3];
  local_b8 = ref_grid;
  if (0 < pRVar2->max) {
    cell = 0;
    do {
      RVar4 = ref_cell_nodes(pRVar2,cell,local_a8);
      if (RVar4 == 0) {
        local_c0 = -1;
        uVar5 = ref_dict_value(ref_dict_bcs,local_a8[pRVar2->node_per],&local_c0);
        if ((uVar5 != 0) && (uVar5 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x547,"ref_phys_strong_sensor_bc",(ulong)uVar5,"bc");
          local_bc = uVar5;
        }
        if ((uVar5 != 5) && (uVar5 != 0)) goto LAB_001b880b;
        RVar6 = ref_phys_wall_distance_bc(local_c0);
        if ((RVar6 != 0) && (iVar8 = pRVar2->node_per, 0 < (long)iVar8)) {
          lVar7 = 0;
          do {
            scalar[local_a8[lVar7]] = local_b0;
            lVar7 = lVar7 + 1;
          } while (iVar8 != lVar7);
        }
      }
      cell = cell + 1;
    } while (cell < pRVar2->max);
  }
  pRVar2 = local_b8->cell[6];
  bVar3 = true;
  if (0 < pRVar2->max) {
    iVar8 = 0;
    do {
      RVar4 = ref_cell_nodes(pRVar2,iVar8,local_a8);
      if (RVar4 == 0) {
        local_c0 = -1;
        uVar5 = ref_dict_value(ref_dict_bcs,local_a8[pRVar2->node_per],&local_c0);
        if ((uVar5 != 0) && (uVar5 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x552,"ref_phys_strong_sensor_bc",(ulong)uVar5,"bc");
          local_bc = uVar5;
        }
        if ((uVar5 != 5) && (uVar5 != 0)) goto LAB_001b880b;
        RVar6 = ref_phys_wall_distance_bc(local_c0);
        if ((RVar6 != 0) && (iVar1 = pRVar2->node_per, 0 < (long)iVar1)) {
          lVar7 = 0;
          do {
            scalar[local_a8[lVar7]] = local_b0;
            lVar7 = lVar7 + 1;
          } while (iVar1 != lVar7);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < pRVar2->max);
    bVar3 = true;
  }
LAB_001b880d:
  if (bVar3) {
    return 0;
  }
  return local_bc;
LAB_001b880b:
  bVar3 = false;
  goto LAB_001b880d;
}

Assistant:

REF_FCN REF_STATUS ref_phys_strong_sensor_bc(REF_GRID ref_grid, REF_DBL *scalar,
                                             REF_DBL strong_value,
                                             REF_DICT ref_dict_bcs) {
  if (ref_grid_twod(ref_grid)) {
    REF_CELL ref_cell;
    REF_INT bc;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
    ref_cell = ref_grid_edg(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
  } else {
    REF_CELL ref_cell;
    REF_INT bc;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
  }
  return REF_SUCCESS;
}